

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

void __thiscall tonk::SessionOutgoing::Shutdown(SessionOutgoing *this)

{
  long lVar1;
  uint uVar2;
  OutputWorker *this_00;
  long in_RDI;
  SiameseResult result;
  uint64_t stats [9];
  Locker locker;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  Lock *in_stack_fffffffffffff458;
  LogStringBuffer *in_stack_fffffffffffff460;
  SiameseEncoder in_stack_fffffffffffff468;
  LogStringBuffer *in_stack_fffffffffffff498;
  LogStringBuffer *pLVar3;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff4a0;
  ulong local_ac0;
  ulong local_ab8;
  SiameseResult local_aac;
  ulong local_aa8 [2];
  ulong local_a98 [6];
  ulong local_a68;
  char *local_a58;
  long local_a50;
  ulong *local_a48;
  char *local_a40;
  ulong *local_a38;
  char *local_a30;
  ulong *local_a28;
  char *local_a20;
  long local_a18;
  char *local_a10;
  ulong *local_a08;
  char *local_a00;
  LogStringBuffer *local_9f8;
  OutputWorker *local_9d8;
  char *local_9d0;
  undefined4 local_9c4;
  long local_9c0;
  undefined4 local_9b4;
  long local_9b0;
  undefined1 local_998 [16];
  ostream aoStack_988 [376];
  char *local_810;
  undefined4 local_804;
  long local_800;
  char *local_7f8;
  string *local_7f0;
  undefined1 *local_7e8;
  long local_7e0;
  string *local_7d8;
  undefined1 *local_7d0;
  long local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  long local_7b0;
  string *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  undefined1 *local_790;
  ulong *local_788;
  char *local_780;
  ulong *local_778;
  char *local_770;
  ulong *local_768;
  char *local_760;
  undefined4 local_754;
  long local_750;
  undefined4 local_744;
  long local_740;
  undefined1 local_728 [16];
  ostream aoStack_718 [376];
  ulong *local_5a0;
  char *local_598;
  ulong *local_590;
  char *local_588;
  ulong *local_580;
  char *local_578;
  undefined4 local_56c;
  long local_568;
  ulong *local_560;
  char *local_558;
  ulong *local_550;
  char *local_548;
  ulong *local_540;
  char *local_538;
  string *local_530;
  undefined1 *local_528;
  long local_520;
  string *local_518;
  undefined1 *local_510;
  long local_508;
  string *local_500;
  undefined1 *local_4f8;
  ulong *local_4f0;
  char *local_4e8;
  ulong *local_4e0;
  char *local_4d8;
  ulong *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  long local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  long local_4a0;
  ulong *local_498;
  char *local_490;
  ulong *local_488;
  char *local_480;
  ulong *local_478;
  undefined1 *local_470;
  long local_468;
  char *local_460;
  undefined1 *local_458;
  ulong *local_450;
  undefined1 *local_448;
  long local_440;
  ulong *local_438;
  char *local_430;
  ulong *local_428;
  char *local_420;
  undefined1 *local_418;
  long local_410;
  ulong *local_408;
  undefined1 *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  long local_3e8;
  ulong *local_3e0;
  char *local_3d8;
  ulong *local_3d0;
  undefined1 *local_3c8;
  long local_3c0;
  ulong *local_3b8;
  undefined1 *local_3b0;
  long local_3a8;
  ulong *local_3a0;
  undefined1 *local_398;
  char *local_390;
  undefined1 *local_388;
  ulong *local_380;
  char *local_378;
  undefined1 *local_370;
  long local_368;
  ulong *local_360;
  undefined1 *local_358;
  long local_350;
  ulong *local_348;
  undefined1 *local_340;
  char *local_338;
  undefined1 *local_330;
  long local_328;
  char *local_320;
  undefined1 *local_318;
  char *local_310;
  ulong *local_308;
  char *local_300;
  undefined4 local_2f4;
  LogStringBuffer *local_2f0;
  undefined4 local_2e4;
  LogStringBuffer *local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  ulong *local_138;
  char *local_130;
  undefined4 local_124;
  LogStringBuffer *local_120;
  char *local_118;
  ulong *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  LogStringBuffer *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  LogStringBuffer *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  ulong *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  char *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  char *local_80;
  ulong *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  ulong *local_60;
  undefined1 *local_58;
  LogStringBuffer *local_50;
  ulong *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_aac = siamese_encoder_stats
                        (in_stack_fffffffffffff468,(uint64_t *)in_stack_fffffffffffff460,
                         (uint)((ulong)in_stack_fffffffffffff458 >> 0x20));
  if (local_aac == Siamese_Success) {
    lVar1 = *(long *)(in_RDI + 0x208);
    local_ab8 = local_a68 / 1000;
    local_a38 = local_aa8;
    local_a48 = local_a98;
    local_a20 = "Siamese encoder stats: Memory used = ";
    local_a28 = &local_ab8;
    local_a30 = " KB, Originals sent = ";
    local_a40 = ", Recoveries sent = ";
    local_754 = 1;
    local_760 = "Siamese encoder stats: Memory used = ";
    local_770 = " KB, Originals sent = ";
    local_780 = ", Recoveries sent = ";
    local_744 = 1;
    local_a18 = lVar1;
    local_788 = local_a48;
    local_778 = local_a38;
    local_768 = local_a28;
    local_750 = lVar1;
    local_740 = lVar1;
    if (*(int *)(lVar1 + 8) < 2) {
      local_56c = 1;
      local_578 = "Siamese encoder stats: Memory used = ";
      local_588 = " KB, Originals sent = ";
      local_598 = ", Recoveries sent = ";
      local_5a0 = local_a48;
      local_590 = local_a38;
      local_580 = local_a28;
      local_568 = lVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,Trace);
      local_530 = (string *)(lVar1 + 0x38);
      local_538 = local_578;
      local_540 = local_580;
      local_548 = local_588;
      local_550 = local_590;
      local_558 = local_598;
      local_560 = local_5a0;
      local_528 = local_728;
      local_520 = lVar1;
      local_518 = local_530;
      local_510 = local_728;
      local_508 = lVar1;
      local_500 = local_530;
      local_4f8 = local_728;
      std::operator<<(aoStack_718,local_530);
      local_4c0 = local_528;
      local_4c8 = local_538;
      local_4d0 = local_540;
      local_4d8 = local_548;
      local_4e0 = local_550;
      local_4e8 = local_558;
      local_4f0 = local_560;
      local_4a8 = local_528;
      local_4b0 = local_538;
      local_458 = local_528;
      local_460 = local_538;
      local_4b8 = lVar1;
      local_4a0 = lVar1;
      std::operator<<((ostream *)(local_528 + 0x10),local_538);
      local_470 = local_4c0;
      local_478 = local_4d0;
      local_480 = local_4d8;
      local_488 = local_4e0;
      local_490 = local_4e8;
      local_498 = local_4f0;
      local_448 = local_4c0;
      local_450 = local_4d0;
      local_400 = local_4c0;
      local_408 = local_4d0;
      local_468 = lVar1;
      local_440 = lVar1;
      std::ostream::operator<<((ostream *)(local_4c0 + 0x10),*local_4d0);
      local_418 = local_470;
      local_420 = local_480;
      local_428 = local_488;
      local_430 = local_490;
      local_438 = local_498;
      local_3f0 = local_470;
      local_3f8 = local_480;
      local_388 = local_470;
      local_390 = local_480;
      local_410 = lVar1;
      local_3e8 = lVar1;
      std::operator<<((ostream *)(local_470 + 0x10),local_480);
      local_3c8 = local_418;
      local_3d0 = local_428;
      local_3d8 = local_430;
      local_3e0 = local_438;
      local_3b0 = local_418;
      local_3b8 = local_428;
      local_398 = local_418;
      local_3a0 = local_428;
      local_3c0 = lVar1;
      local_3a8 = lVar1;
      std::ostream::operator<<((ostream *)(local_418 + 0x10),*local_428);
      local_370 = local_3c8;
      local_378 = local_3d8;
      local_380 = local_3e0;
      local_330 = local_3c8;
      local_338 = local_3d8;
      local_318 = local_3c8;
      local_320 = local_3d8;
      local_368 = lVar1;
      local_328 = lVar1;
      std::operator<<((ostream *)(local_3c8 + 0x10),local_3d8);
      local_358 = local_370;
      local_360 = local_380;
      local_340 = local_370;
      local_348 = local_380;
      local_350 = lVar1;
      std::ostream::operator<<((ostream *)(local_370 + 0x10),*local_380);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e05e4);
    }
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x208);
    local_a58 = "Unable to retrieve siamese encoder stats";
    local_9c4 = 4;
    local_9d0 = "Unable to retrieve siamese encoder stats";
    local_9b4 = 4;
    local_a50 = lVar1;
    local_9c0 = lVar1;
    local_9b0 = lVar1;
    if (*(int *)(lVar1 + 8) < 5) {
      local_804 = 4;
      local_810 = "Unable to retrieve siamese encoder stats";
      local_800 = lVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,Trace);
      local_7f0 = (string *)(lVar1 + 0x38);
      local_7f8 = local_810;
      local_7e8 = local_998;
      local_7e0 = lVar1;
      local_7d8 = local_7f0;
      local_7d0 = local_998;
      local_7c8 = lVar1;
      local_7a8 = local_7f0;
      local_7a0 = local_998;
      std::operator<<(aoStack_988,local_7f0);
      local_7b8 = local_7e8;
      local_7c0 = local_7f8;
      local_790 = local_7e8;
      local_798 = local_7f8;
      local_7b0 = lVar1;
      std::operator<<((ostream *)(local_7e8 + 0x10),local_7f8);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1dfdd9);
    }
  }
  pLVar3 = *(LogStringBuffer **)(in_RDI + 0x208);
  this_00 = (OutputWorker *)(in_RDI + 8);
  local_9d8 = this_00;
  Locker::Locker((Locker *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  uVar2 = pktalloc::Allocator::GetMemoryAllocatedBytes((Allocator *)&this_00->QueueLock);
  Locker::~Locker((Locker *)0x1e0682);
  local_ac0 = (ulong)uVar2 / 1000;
  local_a00 = "Write allocator memory used: ";
  local_a08 = &local_ac0;
  local_a10 = " KB";
  local_2f4 = 1;
  local_300 = "Write allocator memory used: ";
  local_310 = " KB";
  local_2e4 = 1;
  local_9f8 = pLVar3;
  local_308 = local_a08;
  local_2f0 = pLVar3;
  local_2e0 = pLVar3;
  if ((int)pLVar3->LogLevel < 2) {
    local_124 = 1;
    local_130 = "Write allocator memory used: ";
    local_140 = " KB";
    buffer_00 = pLVar3;
    local_138 = local_a08;
    local_120 = pLVar3;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458,Trace);
    local_100 = &pLVar3->field_0x38;
    local_108 = local_130;
    local_110 = local_138;
    local_118 = local_140;
    local_f8 = local_2c8;
    local_f0 = pLVar3;
    local_e8 = local_100;
    local_e0 = local_2c8;
    local_d8 = pLVar3;
    local_d0 = local_100;
    local_c8 = local_2c8;
    std::operator<<(aoStack_2b8,(string *)local_100);
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_90 = local_f8;
    local_98 = local_108;
    local_30 = local_f8;
    local_38 = local_108;
    in_stack_fffffffffffff460 = pLVar3;
    local_a0 = pLVar3;
    local_88 = pLVar3;
    std::operator<<((ostream *)(local_f8 + 0x10),local_108);
    local_70 = local_a8;
    local_78 = local_b8;
    local_80 = local_c0;
    local_58 = local_a8;
    local_60 = local_b8;
    local_40 = local_a8;
    local_48 = local_b8;
    local_68 = in_stack_fffffffffffff460;
    local_50 = in_stack_fffffffffffff460;
    std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
    local_20 = local_70;
    local_28 = local_80;
    local_8 = local_70;
    local_10 = local_80;
    local_18 = in_stack_fffffffffffff460;
    std::operator<<((ostream *)(local_70 + 0x10),local_80);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e0adb);
  }
  siamese_encoder_free((SiameseEncoder)in_stack_fffffffffffff460);
  return;
}

Assistant:

void SessionOutgoing::Shutdown()
{
    uint64_t stats[SiameseEncoderStats_Count];
    SiameseResult result = siamese_encoder_stats(FECEncoder, stats, SiameseEncoderStats_Count);
    if (result != Siamese_Success) {
        Deps.Logger->Error("Unable to retrieve siamese encoder stats");
    }
    else {
        Deps.Logger->Debug("Siamese encoder stats:" \
            " Memory used = ", stats[SiameseEncoderStats_MemoryUsed] / 1000, " KB" \
            ", Originals sent = ", stats[SiameseEncoderStats_OriginalCount],
            ", Recoveries sent = ", stats[SiameseEncoderStats_RecoveryCount]);
    }

    Deps.Logger->Debug("Write allocator memory used: ",
        WriteAllocator.GetUsedMemory() / 1000, " KB");

    siamese_encoder_free(FECEncoder);

    // Note: Allocations are freed automatically by FECEncoder object
}